

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void socket_shutdown_impl(_Bool specify_rdhup)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  ssize_t ret;
  undefined4 uStack_28;
  uint8_t buf;
  epoll_event event;
  uint32_t rdhup_flag;
  int fds [3];
  int ep;
  _Bool specify_rdhup_local;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x40d,"ep >= 0");
  }
  fd_tcp_socket((int *)((long)&event.data + 4));
  event.data.fd = 0;
  if (specify_rdhup) {
    event.data.fd = 0x2000;
  }
  uVar2 = 0x2000;
  if (specify_rdhup) {
    uVar2 = 0;
  }
  ret._4_4_ = uVar2 | 5;
  uStack_28 = event.data.u64._4_4_;
  iVar3 = epoll_ctl(iVar1,1,event.data.u64._4_4_,(epoll_event *)((long)&ret + 4));
  if (iVar3 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x418,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0");
  }
  ret._4_4_ = event.data.u32 | 5;
  iVar3 = epoll_ctl(iVar1,3,event.data.u64._4_4_,(epoll_event *)((long)&ret + 4));
  if (iVar3 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x41b,"epoll_ctl(ep, EPOLL_CTL_MOD, fds[0], &event) == 0");
  }
  iVar3 = shutdown(rdhup_flag,1);
  if (iVar3 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x41d,"shutdown(fds[1], SHUT_WR) == 0");
  }
  while( true ) {
    while( true ) {
      do {
        iVar3 = epoll_wait(iVar1,(epoll_event *)((long)&ret + 4),1,-1);
        if (iVar3 != 1) {
          microatf_fail_require
                    ("%s:%d: %s not met",
                     "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                     ,0x420,"epoll_wait(ep, &event, 1, -1) == 1");
        }
        fprintf(_stderr,"got event: %x\n",(ulong)ret._4_4_);
      } while (ret._4_4_ == 4);
      if (ret._4_4_ != (event.data.u32 | 5)) break;
      sVar4 = read(event.data.u64._4_4_,(void *)((long)&ret + 3),1);
      if (sVar4 != 0) {
        microatf_fail_require
                  ("%s:%d: %s not met",
                   "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                   ,0x42d,"ret == 0");
      }
      iVar3 = shutdown(event.data.u64._4_4_,1);
      if (iVar3 != 0) {
        microatf_fail_require
                  ("%s:%d: %s not met",
                   "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                   ,0x42f,"shutdown(fds[0], SHUT_WR) == 0");
      }
      shutdown(event.data.u64._4_4_,2);
    }
    if (ret._4_4_ == (event.data.u32 | 0x15)) break;
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x43b,"false");
  }
  close(event.data.u64._4_4_);
  iVar3 = epoll_wait(iVar1,(epoll_event *)((long)&ret + 4),1,300);
  if (iVar3 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x43f,"epoll_wait(ep, &event, 1, 300) == 0");
  }
  iVar3 = close(rdhup_flag);
  if (iVar3 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x441,"close(fds[1]) == 0");
  }
  if ((fds[0] != -1) && (iVar3 = close(fds[0]), iVar3 != 0)) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x442,"fds[2] == -1 || close(fds[2]) == 0");
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x443,"close(ep) == 0");
  }
  return;
}

Assistant:

static void
socket_shutdown_impl(bool specify_rdhup)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_tcp_socket(fds);

	uint32_t rdhup_flag = specify_rdhup ? EPOLLRDHUP : 0;

	struct epoll_event event;
	event.events = EPOLLOUT | EPOLLIN | (specify_rdhup ? 0 : EPOLLRDHUP);
	event.data.fd = fds[0];

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0);

	event.events = EPOLLOUT | EPOLLIN | rdhup_flag;
	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_MOD, fds[0], &event) == 0);

	ATF_REQUIRE(shutdown(fds[1], SHUT_WR) == 0);

	for (;;) {
		ATF_REQUIRE(epoll_wait(ep, &event, 1, -1) == 1);

		fprintf(stderr, "got event: %x\n", (int)event.events);

		if (event.events == EPOLLOUT) {
			/* skip spurious event generated by EVFILT_WRITE */
			/* TODO(jan): find a better solution */
			continue;
		}

		if (event.events == (EPOLLOUT | EPOLLIN | rdhup_flag)) {
			uint8_t buf;
			ssize_t ret = read(fds[0], &buf, 1);
			ATF_REQUIRE(ret == 0);

			ATF_REQUIRE(shutdown(fds[0], SHUT_WR) == 0);
			shutdown(fds[0], SHUT_RDWR);
		} else if (event.events ==
		    (EPOLLOUT | EPOLLIN | rdhup_flag | EPOLLHUP)) {
			/* close() may fail here! Don't check return code. */
			close(fds[0]);
			break;
#ifdef __NetBSD__
		} else if (event.events == (EPOLLIN | rdhup_flag)) {
			continue;
#endif
		} else {
			ATF_REQUIRE(false);
		}
	}

	ATF_REQUIRE(epoll_wait(ep, &event, 1, 300) == 0);

	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}